

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.c
# Opt level: O0

void translator_loop_mipsel
               (TranslatorOps_conflict1 *ops,DisasContextBase_conflict1 *db,CPUState *cpu,
               TranslationBlock_conflict *tb,int max_insns)

{
  uc_struct *uc_00;
  TCGContext *tcg_ctx_00;
  _Bool _Var1;
  int iVar2;
  TCGOp *local_60;
  TCGOp *tcg_op;
  CPUBreakpoint *bp;
  TCGOp *pTStack_48;
  _Bool block_hook;
  TCGOp *prev_op;
  TCGContext_conflict4 *tcg_ctx;
  uc_struct_conflict5 *uc;
  int bp_insn;
  int max_insns_local;
  TranslationBlock_conflict *tb_local;
  CPUState *cpu_local;
  DisasContextBase_conflict1 *db_local;
  TranslatorOps_conflict1 *ops_local;
  
  uc._0_4_ = 0;
  uc_00 = (uc_struct *)cpu->uc;
  tcg_ctx_00 = uc_00->tcg_ctx;
  pTStack_48 = (TCGOp *)0x0;
  bp._7_1_ = false;
  db->tb = tb;
  db->pc_first = tb->pc;
  db->pc_next = db->pc_first;
  db->is_jmp = DISAS_NEXT;
  db->num_insns = 0;
  db->max_insns = max_insns;
  db->singlestep_enabled = cpu->singlestep_enabled != 0;
  (*ops->init_disas_context)(db,cpu);
  iVar2 = uc_addr_is_exit(uc_00,(ulong)tb->pc);
  if (iVar2 == 0) {
    bp._7_1_ = _hook_exists_bounded(uc_00->hook[3].head,(ulong)tb->pc);
    if (bp._7_1_) {
      pTStack_48 = tcg_last_op((TCGContext_conflict4 *)tcg_ctx_00);
      gen_uc_tracecode((TCGContext_conflict4 *)tcg_ctx_00,-0x7070708,3,uc_00,(ulong)db->pc_first);
    }
    gen_tb_start((TCGContext_conflict4 *)tcg_ctx_00,db->tb);
    (*ops->tb_start)(db,cpu);
    do {
      db->num_insns = db->num_insns + 1;
      (*ops->insn_start)(db,cpu);
      if (((db->singlestep_enabled & 1U) == 0) &&
         ((cpu->breakpoints).tqh_first != (CPUBreakpoint *)0x0)) {
        for (tcg_op = (TCGOp *)(cpu->breakpoints).tqh_first; tcg_op != (TCGOp *)0x0;
            tcg_op = (TCGOp *)(tcg_op->link).tqe_circ.tql_prev) {
          if ((*(ulong *)tcg_op == (ulong)db->pc_next) &&
             (_Var1 = (*ops->breakpoint_check)(db,cpu,(CPUBreakpoint *)tcg_op), _Var1)) {
            uc._0_4_ = 1;
            break;
          }
        }
        if (DISAS_TOO_MANY < db->is_jmp) goto LAB_00b1a67f;
      }
      (*ops->translate_insn)(db,cpu);
      if (db->is_jmp != DISAS_NEXT) goto LAB_00b1a67f;
      _Var1 = tcg_op_buf_full((TCGContext_conflict4 *)tcg_ctx_00);
    } while ((!_Var1) && (db->num_insns < db->max_insns));
    db->is_jmp = DISAS_TOO_MANY;
  }
  else {
    gen_tb_start((TCGContext_conflict4 *)tcg_ctx_00,db->tb);
    (*ops->tb_start)(db,cpu);
    db->num_insns = db->num_insns + 1;
    (*ops->insn_start)(db,cpu);
    (*ops->translate_insn)(db,cpu);
  }
LAB_00b1a67f:
  (*ops->tb_stop)(db,cpu);
  gen_tb_end((TCGContext_conflict4 *)tcg_ctx_00,db->tb,db->num_insns - (int)uc);
  db->tb->size = (short)db->pc_next - (short)db->pc_first;
  db->tb->icount = (uint16_t)db->num_insns;
  hooked_regions_check(uc_00,(ulong)db->tb->pc,(ulong)db->tb->size);
  if (bp._7_1_ != false) {
    if (pTStack_48 == (TCGOp *)0x0) {
      local_60 = (tcg_ctx_00->ops).tqh_first;
    }
    else {
      local_60 = (pTStack_48->link).tqe_next;
    }
    local_60->args[1] = (ulong)db->tb->size;
  }
  return;
}

Assistant:

void translator_loop(const TranslatorOps *ops, DisasContextBase *db,
                     CPUState *cpu, TranslationBlock *tb, int max_insns)
{
    int bp_insn = 0;
    struct uc_struct *uc = (struct uc_struct *)cpu->uc;
    TCGContext *tcg_ctx = uc->tcg_ctx;
    TCGOp *prev_op = NULL;
    bool block_hook = false;

    /* Initialize DisasContext */
    db->tb = tb;
    db->pc_first = tb->pc;
    db->pc_next = db->pc_first;
    db->is_jmp = DISAS_NEXT;
    db->num_insns = 0;
    db->max_insns = max_insns;
    db->singlestep_enabled = cpu->singlestep_enabled;

    ops->init_disas_context(db, cpu);
    tcg_debug_assert(db->is_jmp == DISAS_NEXT);  /* no early exit */

    /* Reset the temp count so that we can identify leaks */
    tcg_clear_temp_count();

    /* Unicorn: early check to see if the address of this block is
     * the "run until" address. */
    if (uc_addr_is_exit(uc, tb->pc)) {
        // This should catch that instruction is at the end
        // and generate appropriate halting code.
        gen_tb_start(tcg_ctx, db->tb);
        ops->tb_start(db, cpu);
        db->num_insns++;
        ops->insn_start(db, cpu);
        ops->translate_insn(db, cpu);
        goto _end_loop;
    }

    /* Unicorn: trace this block on request
     * Only hook this block if it is not broken from previous translation due to
     * full translation cache
     */
    if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_BLOCK, tb->pc)) {
        prev_op = tcg_last_op(tcg_ctx);
        block_hook = true;
        gen_uc_tracecode(tcg_ctx, 0xf8f8f8f8, UC_HOOK_BLOCK_IDX, uc, db->pc_first);
    }

    // tcg_dump_ops(tcg_ctx, false, "translator loop");

    /* Start translating.  */
    gen_tb_start(tcg_ctx, db->tb);
    // tcg_dump_ops(tcg_ctx, false, "tb start");

    ops->tb_start(db, cpu);
    // tcg_dump_ops(tcg_ctx, false, "tb start 2");

    tcg_debug_assert(db->is_jmp == DISAS_NEXT);  /* no early exit */

    while (true) {
        db->num_insns++;

        ops->insn_start(db, cpu);
        tcg_debug_assert(db->is_jmp == DISAS_NEXT);  /* no early exit */

        /* Pass breakpoint hits to target for further processing */
        if (!db->singlestep_enabled
            && unlikely(!QTAILQ_EMPTY(&cpu->breakpoints))) {
            CPUBreakpoint *bp;
            QTAILQ_FOREACH(bp, &cpu->breakpoints, entry) {
                if (bp->pc == db->pc_next) {
                    if (ops->breakpoint_check(db, cpu, bp)) {
                        bp_insn = 1;
                        break;
                    }
                }
            }
            /* The breakpoint_check hook may use DISAS_TOO_MANY to indicate
               that only one more instruction is to be executed.  Otherwise
               it should use DISAS_NORETURN when generating an exception,
               but may use a DISAS_TARGET_* value for Something Else.  */
            if (db->is_jmp > DISAS_TOO_MANY) {
                break;
            }
        }

        /* Disassemble one instruction.  The translate_insn hook should
           update db->pc_next and db->is_jmp to indicate what should be
           done next -- either exiting this loop or locate the start of
           the next instruction.  */
        ops->translate_insn(db, cpu);
        // tcg_dump_ops(tcg_ctx, false, "insn translate");

        /* Stop translation if translate_insn so indicated.  */
        if (db->is_jmp != DISAS_NEXT) {
            break;
        }

        /* Stop translation if the output buffer is full,
           or we have executed all of the allowed instructions.  */
        if (tcg_op_buf_full(tcg_ctx) || db->num_insns >= db->max_insns) {
            db->is_jmp = DISAS_TOO_MANY;
            break;
        }
    }

_end_loop:
    /* Emit code to exit the TB, as indicated by db->is_jmp.  */
    ops->tb_stop(db, cpu);
    gen_tb_end(tcg_ctx, db->tb, db->num_insns - bp_insn);
    // tcg_dump_ops(tcg_ctx, false, "tb end");

    /* The disas_log hook may use these values rather than recompute.  */
    db->tb->size = db->pc_next - db->pc_first;
    db->tb->icount = db->num_insns;

    hooked_regions_check(uc, db->tb->pc, db->tb->size);

    if (block_hook) {
        TCGOp *tcg_op;

        // Unicorn: patch the callback to have the proper block size.
        if (prev_op) {
            // As explained further up in the function where prev_op is
            // assigned, we move forward in the tail queue, so we're modifying the
            // move instruction generated by gen_uc_tracecode() that contains
            // the instruction size to assign the proper size (replacing 0xF1F1F1F1).
            tcg_op = QTAILQ_NEXT(prev_op, link);
        } else {
            // this basic block is the first emulated code ever,
            // so the basic block operand is the first operand
            tcg_op = QTAILQ_FIRST(&tcg_ctx->ops);
        }

        tcg_op->args[1] = db->tb->size;
    }
}